

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_link(DisasContext_conflict2 *s,uint16_t insn,int32_t offset)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 val;
  TCGTemp *a2;
  TCGv_i32 *ppTVar1;
  TCGv_i32 *ppTVar2;
  uint uVar3;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 ret;
  
  s_00 = s->uc->tcg_ctx;
  uVar3 = insn & 7;
  ppTVar2 = s->writeback;
  ppTVar1 = s_00->cpu_aregs;
  if (((uint)s->writeback_mask >> uVar3 & 1) != 0) {
    ppTVar1 = ppTVar2;
  }
  val = ppTVar1[uVar3];
  a2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a2 - (long)s_00);
  ppTVar1 = ppTVar2;
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  tcg_gen_subi_i32_m68k(s_00,ret,ppTVar1[7],4);
  tcg_gen_qemu_st_i32_m68k
            (s->uc->tcg_ctx,val,ret,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),MO_BEUL);
  if (((short)uVar3 != 7) && (val != ret)) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(val + (long)s_00),(TCGArg)a2);
  }
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  tcg_gen_addi_i32_m68k(s_00,ppTVar2[7],ret,offset);
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void gen_link(DisasContext *s, uint16_t insn, int32_t offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;

    reg = AREG(insn, 0);
    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_subi_i32(tcg_ctx, tmp, QREG_SP, 4);
    gen_store(s, OS_LONG, tmp, reg, IS_USER(s));
    if ((insn & 7) != 7) {
        tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    }
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, tmp, offset);
    tcg_temp_free(tcg_ctx, tmp);
}